

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O0

void __thiscall
inipp::Format<wchar_t>::Format
          (Format<wchar_t> *this,wchar_t section_start,wchar_t section_end,wchar_t assign,
          wchar_t comment,wchar_t interpol,wchar_t interpol_start,wchar_t interpol_sep,
          wchar_t interpol_end)

{
  wchar_t interpol_local;
  wchar_t comment_local;
  wchar_t assign_local;
  wchar_t section_end_local;
  wchar_t section_start_local;
  Format<wchar_t> *this_local;
  
  this->_vptr_Format = (_func_int **)&PTR_is_section_start_0012bcc0;
  this->char_section_start = section_start;
  this->char_section_end = section_end;
  this->char_assign = assign;
  this->char_comment = comment;
  this->char_interpol = interpol;
  this->char_interpol_start = interpol_start;
  this->char_interpol_sep = interpol_sep;
  this->char_interpol_end = interpol_end;
  return;
}

Assistant:

Format(CharT section_start, CharT section_end, CharT assign, CharT comment, CharT interpol, CharT interpol_start, CharT interpol_sep, CharT interpol_end)
		: char_section_start(section_start)
		, char_section_end(section_end)
		, char_assign(assign)
		, char_comment(comment)
		, char_interpol(interpol)
		, char_interpol_start(interpol_start)
		, char_interpol_sep(interpol_sep)
		, char_interpol_end(interpol_end) {}